

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall sptk::reaper::EpochTracker::DoDynamicProgramming(EpochTracker *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference ppEVar6;
  reference pvVar7;
  long in_RDI;
  double dVar8;
  float v_transition_cost_1;
  float v_transition_cost;
  float f_trans_cost;
  float sum_cost;
  size_t phyp;
  float forward_period;
  size_t min_index;
  float min_cost;
  size_t fhyp;
  size_t peak;
  float local_3c;
  ulong local_38;
  ulong local_28;
  float local_1c;
  ulong local_18;
  ulong local_10;
  
  local_10 = 0;
  do {
    sVar4 = std::
            vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
            ::size((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                    *)(in_RDI + 8));
    if (sVar4 <= local_10) {
      return;
    }
    pvVar5 = std::
             vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
             ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                           *)(in_RDI + 8),local_10);
    sVar4 = std::
            vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
            ::size(&pvVar5->past);
    if (sVar4 != 0) {
      local_18 = 0;
      while( true ) {
        pvVar5 = std::
                 vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                               *)(in_RDI + 8),local_10);
        sVar4 = std::
                vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                ::size(&pvVar5->future);
        if (sVar4 <= local_18) break;
        local_1c = 1e+30;
        local_28 = 0;
        pvVar5 = std::
                 vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                               *)(in_RDI + 8),local_10);
        ppEVar6 = std::
                  vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                  ::operator[](&pvVar5->future,local_18);
        iVar3 = (*ppEVar6)->period;
        local_38 = 0;
        while( true ) {
          pvVar5 = std::
                   vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                   ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                 *)(in_RDI + 8),local_10);
          sVar4 = std::
                  vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                  ::size(&pvVar5->past);
          if (sVar4 <= local_38) break;
          pvVar5 = std::
                   vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                   ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                 *)(in_RDI + 8),local_10);
          ppEVar6 = std::
                    vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                    ::operator[](&pvVar5->future,local_18);
          if (((*ppEVar6)->voiced & 1U) == 0) {
LAB_00122f66:
            pvVar5 = std::
                     vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                     ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                   *)(in_RDI + 8),local_10);
            ppEVar6 = std::
                      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                      ::operator[](&pvVar5->future,local_18);
            if (((*ppEVar6)->voiced & 1U) != 0) {
              pvVar5 = std::
                       vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                       ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                     *)(in_RDI + 8),local_10);
              ppEVar6 = std::
                        vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                        ::operator[](&pvVar5->past,local_38);
              if (((*ppEVar6)->voiced & 1U) == 0) {
                fVar1 = *(float *)(in_RDI + 0x1ec);
                pvVar5 = std::
                         vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                         ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                       *)(in_RDI + 8),local_10);
                pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                                   ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),
                                    (long)pvVar5->frame_index);
                fVar2 = *pvVar7;
                pvVar5 = std::
                         vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                         ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                       *)(in_RDI + 8),local_10);
                ppEVar6 = std::
                          vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                          ::operator[](&pvVar5->past,local_38);
                local_3c = (*ppEVar6)->cost_sum + fVar1 * (1.0 - fVar2);
                goto LAB_001231ca;
              }
            }
            pvVar5 = std::
                     vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                     ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                   *)(in_RDI + 8),local_10);
            ppEVar6 = std::
                      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                      ::operator[](&pvVar5->future,local_18);
            if (((*ppEVar6)->voiced & 1U) == 0) {
              pvVar5 = std::
                       vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                       ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                     *)(in_RDI + 8),local_10);
              ppEVar6 = std::
                        vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                        ::operator[](&pvVar5->past,local_38);
              if (((*ppEVar6)->voiced & 1U) != 0) {
                fVar1 = *(float *)(in_RDI + 0x1ec);
                pvVar5 = std::
                         vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                         ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                       *)(in_RDI + 8),local_10);
                pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                                   ((vector<float,_std::allocator<float>_> *)(in_RDI + 200),
                                    (long)pvVar5->frame_index);
                fVar2 = *pvVar7;
                pvVar5 = std::
                         vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                         ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                       *)(in_RDI + 8),local_10);
                ppEVar6 = std::
                          vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                          ::operator[](&pvVar5->past,local_38);
                local_3c = (*ppEVar6)->cost_sum + fVar1 * (1.0 - fVar2);
                goto LAB_001231ca;
              }
            }
            pvVar5 = std::
                     vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                     ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                   *)(in_RDI + 8),local_10);
            ppEVar6 = std::
                      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                      ::operator[](&pvVar5->past,local_38);
            local_3c = (*ppEVar6)->cost_sum;
          }
          else {
            pvVar5 = std::
                     vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                     ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                   *)(in_RDI + 8),local_10);
            ppEVar6 = std::
                      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                      ::operator[](&pvVar5->past,local_38);
            if (((*ppEVar6)->voiced & 1U) == 0) goto LAB_00122f66;
            fVar1 = *(float *)(in_RDI + 0x1e8);
            pvVar5 = std::
                     vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                     ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                   *)(in_RDI + 8),local_10);
            ppEVar6 = std::
                      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                      ::operator[](&pvVar5->past,local_38);
            dVar8 = std::log((double)(ulong)(uint)((float)iVar3 / (float)(*ppEVar6)->period));
            dVar8 = std::fabs(dVar8);
            pvVar5 = std::
                     vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                     ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                                   *)(in_RDI + 8),local_10);
            ppEVar6 = std::
                      vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                      ::operator[](&pvVar5->past,local_38);
            local_3c = fVar1 * SUB84(dVar8,0) + (*ppEVar6)->cost_sum;
          }
LAB_001231ca:
          if (local_3c < local_1c) {
            local_1c = local_3c;
            local_28 = local_38;
          }
          local_38 = local_38 + 1;
        }
        pvVar5 = std::
                 vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                               *)(in_RDI + 8),local_10);
        ppEVar6 = std::
                  vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                  ::operator[](&pvVar5->future,local_18);
        fVar1 = (*ppEVar6)->local_cost;
        pvVar5 = std::
                 vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                               *)(in_RDI + 8),local_10);
        ppEVar6 = std::
                  vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                  ::operator[](&pvVar5->future,local_18);
        (*ppEVar6)->cost_sum = fVar1 + local_1c;
        pvVar5 = std::
                 vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ::operator[]((vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                               *)(in_RDI + 8),local_10);
        ppEVar6 = std::
                  vector<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                  ::operator[](&pvVar5->future,local_18);
        (*ppEVar6)->best_prev_cand = (int32_t)local_28;
        local_18 = local_18 + 1;
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void EpochTracker::DoDynamicProgramming(void) {
  // Perform the dynamic programming iterations over all pulses in
  // the residual.
  // For each pulse in the residual....
  for (size_t peak = 0; peak < resid_peaks_.size(); ++peak) {
    if (resid_peaks_[peak].past.size() == 0) {  // Is this peak an origin?
      continue;
    }
    // For each forward period hypothesis starting at this pulse...
    for (size_t fhyp = 0; fhyp < resid_peaks_[peak].future.size(); ++fhyp) {
      float min_cost = 1.0e30;  //  huge
      size_t min_index = 0;
      float forward_period =  resid_peaks_[peak].future[fhyp]->period;
      // For each of the previous period hyps ending on this pulse...
      for (size_t phyp = 0; phyp < resid_peaks_[peak].past.size(); ++phyp) {
        float sum_cost = 0.0;
        // There are 4 voicing hyps to consider: V->V  V->UV  UV->V  UV->UV
        if (resid_peaks_[peak].future[fhyp]->voiced &&
            resid_peaks_[peak].past[phyp]->voiced) {  // v->v
          float f_trans_cost = freq_trans_wt_ *
              fabs(log(forward_period / resid_peaks_[peak].past[phyp]->period));
          sum_cost = f_trans_cost + resid_peaks_[peak].past[phyp]->cost_sum;
        } else {
          if (resid_peaks_[peak].future[fhyp]->voiced &&
              !resid_peaks_[peak].past[phyp]->voiced) {  // uv->v
            float v_transition_cost = voice_transition_factor_ *
                (1.0 - voice_onset_prob_[resid_peaks_[peak].frame_index]);
            sum_cost = resid_peaks_[peak].past[phyp]->cost_sum +
                v_transition_cost;
          } else {
            if ((!resid_peaks_[peak].future[fhyp]->voiced) &&
                resid_peaks_[peak].past[phyp]->voiced) {  // v->uv
              float v_transition_cost = voice_transition_factor_ *
                  (1.0 - voice_offset_prob_[resid_peaks_[peak].frame_index]);
              sum_cost = resid_peaks_[peak].past[phyp]->cost_sum +
                  v_transition_cost;
            } else {  //  UV->UV
              sum_cost = resid_peaks_[peak].past[phyp]->cost_sum;
            }
          }
        }
        if (sum_cost < min_cost) {
          min_cost = sum_cost;
          min_index = phyp;
        }
      }  // end for each previous period hyp
      resid_peaks_[peak].future[fhyp]->cost_sum =
          resid_peaks_[peak].future[fhyp]->local_cost + min_cost;
      resid_peaks_[peak].future[fhyp]->best_prev_cand = min_index;
    }  // end for each foreward period hyp
  }  // end for each pulse in the residual signal.
  // Here ends the dynamic programming.
}